

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  Mat *src;
  Mat *this_01;
  void *__ptr;
  Allocator *pAVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined8 uVar14;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined8 uVar29;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  int *piVar40;
  pointer pMVar41;
  int iVar42;
  int *piVar43;
  ulong uVar44;
  int q_1;
  size_t sVar45;
  uint uVar46;
  int iVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  int q;
  int z;
  ulong uVar51;
  long lVar52;
  Option *pOVar53;
  undefined1 auVar54 [16];
  Mat m;
  int _outw;
  int _woffset;
  Mat m_1;
  int _outh;
  int _outc;
  int _hoffset;
  int _outd;
  int _coffset;
  Option *local_f8;
  size_t local_f0;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  long local_d8;
  int _doffset;
  undefined1 local_c8 [16];
  int local_ac;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined3 uVar17;
  undefined1 uVar18;
  undefined2 uVar19;
  undefined1 uVar20;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined3 uVar32;
  undefined1 uVar33;
  undefined2 uVar34;
  undefined1 uVar35;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  iVar42 = src->c;
  auVar54._0_4_ = src->dims;
  auVar54._4_4_ = src->w;
  uVar1 = src->h;
  uVar2 = src->d;
  auVar54._8_8_ = CONCAT44(uVar2,uVar1);
  sVar45 = src->elemsize;
  iVar49 = src->elempack;
  iVar47 = src[1].elempack;
  lVar48 = (long)iVar47;
  local_ac = iVar49;
  if (iVar49 != 4) goto LAB_0023ec7c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
  local_c8._8_4_ = uVar1;
  local_c8._0_8_ = auVar54._8_8_;
  local_c8._12_4_ = uVar2;
  iVar49 = 1;
  m.elempack = iVar49;
  m.dims = iVar49;
  m.w = auVar54._4_4_;
  m.h = uVar1;
  m.d = uVar2;
  local_f8 = opt;
  local_f0 = sVar45;
  local_e8 = auVar54._4_4_;
  iStack_e4 = auVar54._4_4_;
  iStack_e0 = auVar54._4_4_;
  iStack_dc = auVar54._4_4_;
  local_d8 = lVar48;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) != -0xe9) {
    switch(auVar54._0_4_ + -1) {
    case 0:
      m.w = auVar54._4_4_ << 2;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      m.cstep = (size_t)m.w;
      break;
    case 1:
      m.h = uVar1 << 2;
      m.dims = 2;
      m.d = 1;
      m.c = 1;
      m.cstep = (long)m.h * (long)(int)auVar54._4_4_;
      break;
    case 2:
      m.c = iVar42 * 4;
      m.elemsize = 4;
      m.dims = 3;
      m.cstep = (long)(int)uVar1 * (long)(int)auVar54._4_4_ + 3U & 0x3ffffffffffffffc;
      m.d = iVar49;
      goto LAB_0023e42e;
    case 3:
      m.c = iVar42 * 4;
      m.dims = 4;
      m.cstep = (long)(int)uVar2 * (long)(int)uVar1 * (long)(int)auVar54._4_4_ + 3U &
                0x3ffffffffffffffc;
      break;
    default:
      m.cstep = 0;
      m.elemsize = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      goto LAB_0023e42e;
    }
    m.elempack = 1;
    m.elemsize = 4;
LAB_0023e42e:
    m.allocator = (Allocator *)0x0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.data = (void *)0x0;
    switch(src[1].dims) {
    case 1:
      m_1.cstep = src[1].w * lVar48;
      m_1.elemsize = 4;
      m_1.elempack = 1;
      m_1.w = (int)m_1.cstep;
      m_1.h = 1;
      m_1.d = 1;
      m_1.c = 1;
      m_1.dims = iVar49;
      break;
    case 2:
      m_1.w = src[1].w;
      m_1.elemsize = 4;
      m_1.elempack = 1;
      lVar48 = src[1].h * lVar48;
      m_1.dims = 2;
      m_1.h = (int)lVar48;
      m_1.d = 1;
      m_1.c = 1;
      m_1.cstep = lVar48 * m_1.w;
      break;
    case 3:
      m_1.w = src[1].w;
      m_1.h = src[1].h;
      m_1.c = src[1].c * iVar47;
      m_1.elemsize = 4;
      m_1.dims = 3;
      m_1.d = 1;
      m_1.cstep = (long)m_1.h * (long)m_1.w + 3U & 0x3ffffffffffffffc;
      m_1.elempack = iVar49;
      break;
    case 4:
      m_1.w = src[1].w;
      m_1.h = src[1].h;
      m_1.d = src[1].d;
      m_1.elemsize = 4;
      m_1.elempack = 1;
      m_1.c = src[1].c * iVar47;
      m_1.dims = 4;
      m_1.cstep = (long)m_1.h * (long)m_1.w * (long)m_1.d + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m_1.cstep = 0;
      m_1.elemsize = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
    }
    m_1.allocator = (Allocator *)0x0;
    m_1.refcount._4_4_ = 0;
    m_1.refcount._0_4_ = 0;
    m_1.data = (void *)0x0;
    piVar43 = &_hoffset;
    Crop::resolve_crop_roi
              (this_00,&m,&m_1,&_woffset,piVar43,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar40 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          free(m_1.data);
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar40 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 != 0) goto LAB_0023e6d0;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_0023e6d0;
      }
      goto LAB_0023e6c8;
    }
    goto LAB_0023e6d0;
  }
  switch(auVar54._0_4_ + -1) {
  case 0:
    m.w = auVar54._4_4_ << 2;
    m.h = 1;
    m.cstep = (size_t)m.w;
    goto LAB_0023e2dc;
  case 1:
    m.h = uVar1 << 2;
    m.dims = 2;
    m.cstep = (long)m.h * (long)(int)auVar54._4_4_;
LAB_0023e2dc:
    m.c = 1;
    m.d = 1;
    m.elempack = 1;
    m.elemsize = 4;
    break;
  case 2:
    m.c = iVar42 * 4;
    m.elemsize = 4;
    m.dims = 3;
    m.d = 1;
    m.cstep = (long)(int)uVar1 * (long)(int)auVar54._4_4_ + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    m.c = iVar42 * 4;
    m.elemsize = 4;
    m.elempack = 1;
    m.dims = 4;
    m.cstep = (long)(int)uVar2 * (long)(int)uVar1 * (long)(int)auVar54._4_4_ + 3U &
              0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.allocator = (Allocator *)0x0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.data = (void *)0x0;
  piVar43 = &_hoffset;
  Crop::resolve_crop_roi
            (this_00,&m,(int *)src[1].data,&_woffset,piVar43,&_doffset,&_coffset,&_outw,&_outh,
             &_outd,&_outc);
  piVar40 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_0023e6c8:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0023e6d0:
  pOVar53 = local_f8;
  if (3 < auVar54._0_4_ - 1) goto LAB_0023ec52;
  iVar49 = local_c8._0_4_;
  iVar47 = _outc >> 2;
  switch(auVar54._0_4_) {
  case 1:
    uVar46 = _outw & 3;
    iVar42 = (uint)(uVar46 == 0) * 3 + 1;
    uVar44 = (long)_outw % (long)iVar42;
    if (local_e8 == _outw / iVar42 && uVar46 == 0) {
      if (this_01 == src) {
        return 0;
      }
      piVar43 = src->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + 1;
        UNLOCK();
      }
      piVar43 = this_01->refcount;
      if (piVar43 == (int *)0x0) goto LAB_0023f00d;
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) goto LAB_0023f00d;
      __ptr = this_01->data;
      pAVar3 = this_01->allocator;
joined_r0x0023e90f:
      if (pAVar3 == (Allocator *)0x0) {
        free(__ptr);
      }
      else {
        (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,uVar44 & 0xffffffff);
      }
LAB_0023f00d:
      this_01->cstep = 0;
      this_01->data = (void *)0x0;
      this_01->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&this_01->refcount + 4) = (undefined1  [16])0x0;
      this_01->c = 0;
      this_01->dims = 0;
      this_01->w = 0;
      this_01->h = 0;
      this_01->d = 0;
      piVar43 = src->refcount;
      this_01->data = src->data;
      this_01->refcount = piVar43;
      this_01->elemsize = src->elemsize;
      this_01->elempack = src->elempack;
      this_01->allocator = src->allocator;
      iVar42 = src->w;
      iVar49 = src->h;
      iVar47 = src->d;
      this_01->dims = src->dims;
      this_01->w = iVar42;
      this_01->h = iVar49;
      this_01->d = iVar47;
      this_01->c = src->c;
      this_01->cstep = src->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(this_01,_outw / iVar42,(local_f0 >> 2) << (uVar46 == 0) * '\x02',iVar42,
                  local_f8->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      crop_pack4_sse(src,this_01,0,_woffset / 4);
      return 0;
    }
    break;
  case 2:
    if (_outw == local_e8) {
      iVar42 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar44 = (long)_outh % (long)iVar42;
      if (((_outh & 3U) == 0) && (_outh / iVar42 == iVar49)) {
        if (this_01 == src) {
          return 0;
        }
        piVar43 = src->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = this_01->refcount;
        if (piVar43 == (int *)0x0) goto LAB_0023f00d;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_0023f00d;
        __ptr = this_01->data;
        pAVar3 = this_01->allocator;
        goto joined_r0x0023e90f;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(this_01,_outw,_outh >> 2,(local_f0 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_f8->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      crop_pack4_sse(src,this_01,_hoffset / 4,_woffset);
      return 0;
    }
    break;
  case 3:
    uVar46 = _outc & 3;
    uVar51 = local_f0 >> 2;
    bVar4 = iVar49 == _outh;
    bVar5 = local_e8 == _outw;
    if (bVar4 && bVar5) {
      iVar49 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar44 = (long)_outc % (long)iVar49;
      if (((_outc & 3U) == 0) && (_outc / iVar49 == iVar42)) {
        if (this_01 == src) {
          return 0;
        }
        piVar43 = src->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = this_01->refcount;
        if (piVar43 == (int *)0x0) goto LAB_0023f00d;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_0023f00d;
        __ptr = this_01->data;
        pAVar3 = this_01->allocator;
        goto joined_r0x0023e90f;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    m.w = src->w;
    m.h = src->h;
    m.d = src->d;
    m.elemsize = src->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * src->cstep * m.elemsize + (long)src->data);
    m.elempack = src->elempack;
    m.allocator = src->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = src->dims;
    m.c = iVar47;
    if (bVar4 && bVar5) {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,
                 (void *)CONCAT71((int7)((ulong)piVar43 >> 8),bVar4 && bVar5));
      piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (this_01 != &m_1) {
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = this_01->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 == 0) {
            if (this_01->allocator == (Allocator *)0x0) {
              free(this_01->data);
            }
            else {
              (*this_01->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_01->data = m_1.data;
        piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        this_01->refcount = piVar43;
        this_01->elemsize = m_1.elemsize;
        this_01->elempack = m_1.elempack;
        this_01->allocator = m_1.allocator;
        this_01->dims = m_1.dims;
        this_01->w = m_1.w;
        this_01->h = m_1.h;
        this_01->d = m_1.d;
        this_01->c = m_1.c;
        this_01->cstep = m_1.cstep;
      }
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar42 = -100;
      if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
      goto LAB_0023f121;
    }
    else {
LAB_0023f121:
      Mat::create(this_01,_outw,_outh,_outc / 4,uVar51 << (uVar46 == 0) * '\x02',4,
                  pOVar53->blob_allocator);
      iVar42 = -100;
      if ((this_01->data != (void *)0x0) &&
         (uVar44 = (ulong)this_01->c, this_01->cstep * uVar44 != 0)) {
        iVar42 = 0;
        for (lVar48 = 0; lVar48 < (int)uVar44; lVar48 = lVar48 + 1) {
          m_1.data = (void *)(m.cstep * lVar48 * m.elemsize + (long)m.data);
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize = m.elemsize;
          m_1.elempack = m.elempack;
          m_1.allocator = m.allocator;
          m_1.w = m.w;
          m_1.h = m.h;
          m_1.d = 1;
          m_1.c = m.d;
          m_1.dims = m.dims + -1;
          m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
          if (m.dims == 4) {
            m_1.cstep = (long)m.h * (long)m.w;
          }
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(this_01->cstep * lVar48 *
                         (long)bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)this_01->data);
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          uVar44 = (ulong)(uint)this_01->c;
        }
      }
    }
    piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar43 == (int *)0x0) {
      return iVar42;
    }
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 != 0) {
      return iVar42;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar42;
    }
    goto LAB_0023ef94;
  case 4:
    local_f0 = (local_f0 >> 2) << ((_outc & 3U) == 0) * '\x02';
    if (uVar2 == _outd && (iVar49 == _outh && local_e8 == _outw)) {
      iVar50 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar44 = (long)_outc % (long)iVar50;
      if (((_outc & 3U) == 0) && (_outc / iVar50 == iVar42)) {
        if (this_01 == src) {
          return 0;
        }
        piVar43 = src->refcount;
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + 1;
          UNLOCK();
        }
        piVar43 = this_01->refcount;
        if (piVar43 == (int *)0x0) goto LAB_0023f00d;
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 != 0) goto LAB_0023f00d;
        __ptr = this_01->data;
        pAVar3 = this_01->allocator;
        goto joined_r0x0023e90f;
      }
    }
    if (((_coffset | _outc) & 3U) == 0) {
      m.w = src->w;
      m.h = src->h;
      m.d = src->d;
      m.elemsize = src->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * src->cstep * m.elemsize + (long)src->data);
      m.elempack = src->elempack;
      m.allocator = src->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = src->dims;
      m.c = iVar47;
      if (uVar2 != _outd || (iVar49 != _outh || local_e8 != _outw)) {
LAB_0023f3d1:
        iVar42 = -100;
        Mat::create(this_01,_outw,_outh,_outd,_outc / 4,local_f0,4,pOVar53->blob_allocator);
        if ((this_01->data != (void *)0x0) &&
           (uVar44 = (ulong)this_01->c, this_01->cstep * uVar44 != 0)) {
          for (lVar48 = 0; lVar48 < (int)uVar44; lVar48 = lVar48 + 1) {
            for (lVar52 = 0; lVar52 < _outd; lVar52 = lVar52 + 1) {
              m_1.cstep = (long)m.h * (long)m.w;
              m_1.data = (void *)((long)m.data +
                                 (long)(_doffset + (int)lVar52) * m.elemsize * m_1.cstep +
                                 m.cstep * lVar48 * m.elemsize);
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize = m.elemsize;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.dims = 2;
              m_1.w = m.w;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = 1;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)this_01->data +
                            lVar52 * (long)bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage *
                            (long)this_01->h * (long)this_01->w +
                            this_01->cstep * lVar48 *
                            (long)bottom_blobs_unpacked.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
            }
            uVar44 = (ulong)(uint)this_01->c;
          }
          iVar42 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
        pOVar53 = local_f8;
        piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        iVar42 = -100;
        if (this_01 != &m_1) {
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + 1;
            UNLOCK();
          }
          piVar43 = this_01->refcount;
          if (piVar43 != (int *)0x0) {
            LOCK();
            *piVar43 = *piVar43 + -1;
            UNLOCK();
            if (*piVar43 == 0) {
              if (this_01->allocator == (Allocator *)0x0) {
                free(this_01->data);
              }
              else {
                (*this_01->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_01->data = m_1.data;
          piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          this_01->refcount = piVar43;
          this_01->elemsize = m_1.elemsize;
          this_01->elempack = m_1.elempack;
          this_01->allocator = m_1.allocator;
          this_01->dims = m_1.dims;
          this_01->w = m_1.w;
          this_01->h = m_1.h;
          this_01->d = m_1.d;
          this_01->c = m_1.c;
          this_01->cstep = m_1.cstep;
        }
        if (piVar43 != (int *)0x0) {
          LOCK();
          *piVar43 = *piVar43 + -1;
          UNLOCK();
          if (*piVar43 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
        goto LAB_0023f3d1;
      }
      piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar43 == (int *)0x0) {
        return iVar42;
      }
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 != 0) {
        return iVar42;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar42;
      }
      goto LAB_0023ef94;
    }
  }
LAB_0023ec52:
  sVar45 = src->elemsize;
  iVar49 = src->elempack;
  auVar54._0_4_ = src->dims;
  auVar54._4_4_ = src->w;
  auVar54._8_4_ = src->h;
  auVar54._12_4_ = src->d;
  iVar42 = src->c;
  iVar47 = (int)local_d8;
  opt = local_f8;
LAB_0023ec7c:
  m.data = src->data;
  piVar43 = src->refcount;
  m.refcount._0_4_ = SUB84(piVar43,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar43 >> 0x20);
  m.allocator = src->allocator;
  m.dims = auVar54._0_4_;
  m.w = auVar54._4_4_;
  m.h = auVar54._8_4_;
  m.d = auVar54._12_4_;
  m.cstep = src->cstep;
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + 1;
    UNLOCK();
  }
  m.elemsize = sVar45;
  m.elempack = iVar49;
  m.c = iVar42;
  if (local_ac != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    uVar6 = opt->openmp_blocktime;
    uVar7 = opt->use_winograd_convolution;
    uVar9 = opt->use_sgemm_convolution;
    uVar11 = opt->use_int8_inference;
    uVar13 = opt->use_vulkan_compute;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar14._0_1_ = opt->use_shader_pack8;
    uVar14._1_1_ = opt->use_subgroup_basic;
    uVar14._2_1_ = opt->use_subgroup_vote;
    uVar14._3_1_ = opt->use_subgroup_ballot;
    uVar15 = opt->use_subgroup_shuffle;
    uVar16 = opt->use_image_storage;
    uVar18 = opt->use_tensor_storage;
    uVar20 = opt->use_reserved_0;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar14._4_4_ = CONCAT31(uVar17,uVar15);
    uVar21 = opt->flush_denormals;
    uVar22 = opt->use_local_pool_allocator;
    uVar24 = opt->use_shader_local_memory;
    uVar26 = opt->use_cooperative_matrix;
    uVar28 = opt->use_winograd23_convolution;
    uVar27 = CONCAT11(uVar28,uVar26);
    uVar25 = CONCAT21(uVar27,uVar24);
    uVar23 = CONCAT31(uVar25,uVar22);
    uVar29._0_1_ = opt->use_winograd43_convolution;
    uVar29._1_1_ = opt->use_winograd63_convolution;
    uVar29._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar29._3_1_ = opt->use_reserved_7;
    uVar30 = opt->use_reserved_8;
    uVar31 = opt->use_reserved_9;
    uVar33 = opt->use_reserved_10;
    uVar35 = opt->use_reserved_11;
    uVar34 = CONCAT11(uVar35,uVar33);
    uVar32 = CONCAT21(uVar34,uVar31);
    uVar29._4_4_ = CONCAT31(uVar32,uVar30);
    m_1.c = (int)uVar29;
    m_1.dims = (int)uVar14;
    m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m_1.elempack = uVar6;
    m_1._28_4_ = uVar8;
    m_1.w = uVar14._4_4_;
    m_1.h = uVar21;
    m_1.d = uVar23;
    m_1._60_4_ = uVar29._4_4_;
    convert_packing(src,&m,1,(Option *)&m_1);
  }
  m_1.data = src[1].data;
  piVar43 = src[1].refcount;
  m_1.refcount._0_4_ = SUB84(piVar43,0);
  m_1.refcount._4_4_ = (undefined4)((ulong)piVar43 >> 0x20);
  m_1.elemsize = src[1].elemsize;
  m_1.elempack = src[1].elempack;
  m_1.allocator = src[1].allocator;
  uVar36 = src[1].dims;
  uVar37 = src[1].w;
  uVar38 = src[1].h;
  uVar39 = src[1].d;
  m_1.c = src[1].c;
  m_1.cstep = src[1].cstep;
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + 1;
    UNLOCK();
  }
  m_1.dims = uVar36;
  m_1.w = uVar37;
  m_1.h = uVar38;
  m_1.d = uVar39;
  if (iVar47 != 1) {
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(src + 1,&m_1,1,(Option *)&bottom_blobs_unpacked);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,2,(allocator_type *)&_woffset);
  pMVar41 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + 1;
      UNLOCK();
    }
    piVar43 = (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->refcount;
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar41->cstep = 0;
    pMVar41->data = (void *)0x0;
    pMVar41->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar41->refcount + 4) = (undefined1  [16])0x0;
    pMVar41->c = 0;
    pMVar41->dims = 0;
    pMVar41->w = 0;
    pMVar41->h = 0;
    pMVar41->d = 0;
    pMVar41->data = m.data;
    pMVar41->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar41->elemsize = m.elemsize;
    pMVar41->elempack = m.elempack;
    pMVar41->allocator = m.allocator;
    pMVar41->dims = m.dims;
    pMVar41->w = m.w;
    pMVar41->h = m.h;
    pMVar41->d = m.d;
    pMVar41->c = m.c;
    pMVar41->cstep = m.cstep;
  }
  pMVar41 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != &m_1) {
    piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + 1;
      UNLOCK();
    }
    piVar43 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].refcount;
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          free(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start[1].data);
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar41[1].data = m_1.data;
    pMVar41[1].refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    pMVar41[1].elemsize = m_1.elemsize;
    pMVar41[1].elempack = m_1.elempack;
    pMVar41[1].allocator = m_1.allocator;
    pMVar41[1].dims = m_1.dims;
    pMVar41[1].w = m_1.w;
    pMVar41[1].h = m_1.h;
    pMVar41[1].d = m_1.d;
    pMVar41[1].c = m_1.c;
    pMVar41[1].cstep = m_1.cstep;
  }
  iVar42 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                         &bottom_blobs_unpacked,top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  piVar43 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (m_1.allocator == (Allocator *)0x0) {
        free(m_1.data);
      }
      else {
        (*(m_1.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar43 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_0023ef94:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar42;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}